

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::setLayoutQualifier
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *id)

{
  EShLanguage EVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_type sVar7;
  char *pcVar8;
  _func_int *UNRECOVERED_JUMPTABLE;
  TBlendEquationShift be;
  TBlendEquationShift e;
  int *piVar9;
  uint uVar10;
  bool bVar11;
  
  sVar2 = id->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (id->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      iVar4 = tolower((int)pcVar3[sVar7]);
      pcVar3[sVar7] = (char)iVar4;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"column_major");
  if (iVar4 == 0) {
    uVar5 = (*(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff) + 0x2000000000000000;
LAB_0039460c:
    *(ulong *)&qualifier->field_0x8 = uVar5;
    return;
  }
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"row_major");
  if (iVar4 == 0) {
    uVar5 = *(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
    goto LAB_0039460c;
  }
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"push_constant");
  if (iVar4 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
              (this,loc,"push_constant");
    qualifier->layoutPushConstant = true;
    return;
  }
  if (((this->super_TParseContextBase).super_TParseVersions.language & ~EShLangTessControl) ==
      EShLangTessEvaluation) {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"triangles");
    if (iVar4 != 0) {
      EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
      if (EVar1 == EShLangTessEvaluation) {
        iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"triangles");
        if (((((iVar4 != 0) &&
              (iVar4 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                       compare(id,"quads"), iVar4 != 0)) &&
             (iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"isolines"), iVar4 != 0)) &&
            ((iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"equal_spacing"), iVar4 != 0 &&
             (iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"fractional_even_spacing"), iVar4 != 0)))) &&
           ((iVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"fractional_odd_spacing"), iVar4 != 0 &&
            ((iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"cw"), iVar4 != 0 &&
             (iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"ccw"), iVar4 != 0)))))) {
          pcVar8 = "point_mode";
          goto LAB_0039452b;
        }
      }
      else {
        if (EVar1 != EShLangGeometry) {
          __assert_fail("language == EShLangTessEvaluation",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                        ,0x1bfb,
                        "void glslang::HlslParseContext::setLayoutQualifier(const TSourceLoc &, TQualifier &, TString &)"
                       );
        }
        iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,"points");
        if ((((iVar4 != 0) &&
             (iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"line_strip"), iVar4 != 0)) &&
            (iVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"lines"), iVar4 != 0)) &&
           ((iVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"lines_adjacency"), iVar4 != 0 &&
            (iVar4 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"triangles_adjacency"), iVar4 != 0)))) {
          pcVar8 = "triangle_strip";
LAB_0039452b:
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,pcVar8);
          if (iVar4 != 0) goto LAB_0039453b;
        }
      }
    }
LAB_003946e7:
    pcVar8 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
    pcVar6 = "ignored";
  }
  else {
LAB_0039453b:
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
      iVar4 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"origin_upper_left");
      if (((iVar4 == 0) ||
          (iVar4 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(id,"pixel_center_integer"), iVar4 == 0)) ||
         (iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,"early_fragment_tests"), iVar4 == 0)) goto LAB_003946e7;
      uVar10 = 1;
      bVar11 = false;
      piVar9 = &DAT_0070d92c;
      do {
        pcVar8 = "none";
        if (uVar10 < 5) {
          pcVar8 = (char *)((long)&DAT_0070d92c + (long)*piVar9);
        }
        iVar4 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (id,pcVar8);
        if (iVar4 == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,loc,"ignored",(id->_M_dataplus)._M_p,"");
          if (!bVar11) {
            return;
          }
          break;
        }
        bVar11 = 3 < uVar10;
        uVar10 = uVar10 + 1;
        piVar9 = piVar9 + 1;
      } while (uVar10 != 5);
      e = EBlendMultiply;
      iVar4 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,0,0xd,"blend_support");
      if (iVar4 == 0) {
        do {
          pcVar8 = TQualifier::getBlendEquationString(e);
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(id,pcVar8);
          if (iVar4 == 0) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                      (this,loc,1,&E_GL_KHR_blend_equation_advanced,"blend equation");
            piVar9 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                      blendEquations;
            *piVar9 = *piVar9 | 1 << ((byte)e & 0x1f);
            pcVar8 = (id->_M_dataplus)._M_p;
            UNRECOVERED_JUMPTABLE =
                 (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
            pcVar6 = "ignored";
            goto LAB_0039476d;
          }
          e = e + EBlendScreen;
        } while (e != EBlendCount);
        UNRECOVERED_JUMPTABLE =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar6 = "unknown blend equation";
        pcVar8 = "blend_support";
        goto LAB_0039476d;
      }
    }
    pcVar8 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar6 = "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)";
  }
LAB_0039476d:
  (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar6,pcVar8,"",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::setLayoutQualifier(const TSourceLoc& loc, TQualifier& qualifier, TString& id)
{
    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == TQualifier::getLayoutMatrixString(ElmColumnMajor)) {
        qualifier.layoutMatrix = ElmRowMajor;
        return;
    }
    if (id == TQualifier::getLayoutMatrixString(ElmRowMajor)) {
        qualifier.layoutMatrix = ElmColumnMajor;
        return;
    }
    if (id == "push_constant") {
        requireVulkan(loc, "push_constant");
        qualifier.layoutPushConstant = true;
        return;
    }
    if (language == EShLangGeometry || language == EShLangTessEvaluation) {
        if (id == TQualifier::getGeometryString(ElgTriangles)) {
            // publicType.shaderQualifiers.geometry = ElgTriangles;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (language == EShLangGeometry) {
            if (id == TQualifier::getGeometryString(ElgPoints)) {
                // publicType.shaderQualifiers.geometry = ElgPoints;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLineStrip)) {
                // publicType.shaderQualifiers.geometry = ElgLineStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLines)) {
                // publicType.shaderQualifiers.geometry = ElgLines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgLinesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgLinesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTrianglesAdjacency)) {
                // publicType.shaderQualifiers.geometry = ElgTrianglesAdjacency;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgTriangleStrip)) {
                // publicType.shaderQualifiers.geometry = ElgTriangleStrip;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        } else {
            assert(language == EShLangTessEvaluation);

            // input primitive
            if (id == TQualifier::getGeometryString(ElgTriangles)) {
                // publicType.shaderQualifiers.geometry = ElgTriangles;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgQuads)) {
                // publicType.shaderQualifiers.geometry = ElgQuads;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getGeometryString(ElgIsolines)) {
                // publicType.shaderQualifiers.geometry = ElgIsolines;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // vertex spacing
            if (id == TQualifier::getVertexSpacingString(EvsEqual)) {
                // publicType.shaderQualifiers.spacing = EvsEqual;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalEven)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalEven;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexSpacingString(EvsFractionalOdd)) {
                // publicType.shaderQualifiers.spacing = EvsFractionalOdd;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // triangle order
            if (id == TQualifier::getVertexOrderString(EvoCw)) {
                // publicType.shaderQualifiers.order = EvoCw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == TQualifier::getVertexOrderString(EvoCcw)) {
                // publicType.shaderQualifiers.order = EvoCcw;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }

            // point mode
            if (id == "point_mode") {
                // publicType.shaderQualifiers.pointMode = true;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
    }
    if (language == EShLangFragment) {
        if (id == "origin_upper_left") {
            // publicType.shaderQualifiers.originUpperLeft = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "pixel_center_integer") {
            // publicType.shaderQualifiers.pixelCenterInteger = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "early_fragment_tests") {
            // publicType.shaderQualifiers.earlyFragmentTests = true;
            warn(loc, "ignored", id.c_str(), "");
            return;
        }
        for (TLayoutDepth depth = (TLayoutDepth)(EldNone + 1); depth < EldCount; depth = (TLayoutDepth)(depth + 1)) {
            if (id == TQualifier::getLayoutDepthString(depth)) {
                // publicType.shaderQualifiers.layoutDepth = depth;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
        }
        if (id.compare(0, 13, "blend_support") == 0) {
            bool found = false;
            for (TBlendEquationShift be = (TBlendEquationShift)0; be < EBlendCount; be = (TBlendEquationShift)(be + 1)) {
                if (id == TQualifier::getBlendEquationString(be)) {
                    requireExtensions(loc, 1, &E_GL_KHR_blend_equation_advanced, "blend equation");
                    intermediate.addBlendEquation(be);
                    // publicType.shaderQualifiers.blendEquation = true;
                    warn(loc, "ignored", id.c_str(), "");
                    found = true;
                    break;
                }
            }
            if (! found)
                error(loc, "unknown blend equation", "blend_support", "");
            return;
        }
    }
    error(loc, "unrecognized layout identifier, or qualifier requires assignment (e.g., binding = 4)", id.c_str(), "");
}